

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_helpers.hpp
# Opt level: O0

void duckdb::DecimalToString::FormatDecimal<short>
               (short value,uint8_t width,uint8_t scale,char *dst,idx_t len)

{
  unsigned_short uVar1;
  uint uVar2;
  uint uVar3;
  int in;
  undefined1 *in_RCX;
  byte in_DL;
  int in_00;
  byte in_SIL;
  short in_DI;
  long in_R8;
  int major;
  int minor;
  char *end;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffdc;
  char *local_10;
  short local_2;
  
  uVar1 = (unsigned_short)((uint)in_stack_ffffffffffffffdc >> 0x10);
  local_2 = in_DI;
  if (in_DI < 0) {
    local_2 = -in_DI;
    *in_RCX = 0x2d;
  }
  if (in_DL == 0) {
    UnsafeNumericCast<unsigned_short,_short,_void>(local_2);
    NumericHelper::FormatUnsigned<unsigned_short>
              (uVar1,(char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  }
  else {
    uVar1 = UnsafeNumericCast<unsigned_short,_short,_void>(local_2);
    uVar2 = (uint)uVar1;
    uVar1 = UnsafeNumericCast<unsigned_short,_long,_void>
                      (*(long *)(NumericHelper::POWERS_OF_TEN + (ulong)in_DL * 8));
    in_00 = (int)uVar2 % (int)(uint)uVar1;
    uVar1 = UnsafeNumericCast<unsigned_short,_short,_void>(local_2);
    uVar3 = (uint)uVar1;
    uVar1 = UnsafeNumericCast<unsigned_short,_long,_void>
                      (*(long *)(NumericHelper::POWERS_OF_TEN + (ulong)in_DL * 8));
    in = (int)uVar3 / (int)(uint)uVar1;
    UnsafeNumericCast<unsigned_short,_int,_void>(in_00);
    uVar1 = (unsigned_short)((uint)in_00 >> 0x10);
    local_10 = NumericHelper::FormatUnsigned<unsigned_short>(uVar1,(char *)CONCAT44(uVar3,uVar2));
    while (in_RCX + (in_R8 - (int)(uint)in_DL) < local_10) {
      local_10[-1] = '0';
      local_10 = local_10 + -1;
    }
    local_10[-1] = '.';
    if (in_DL < in_SIL) {
      UnsafeNumericCast<unsigned_short,_int,_void>(in);
      NumericHelper::FormatUnsigned<unsigned_short>(uVar1,(char *)CONCAT44(uVar3,uVar2));
    }
  }
  return;
}

Assistant:

static void FormatDecimal(SIGNED value, uint8_t width, uint8_t scale, char *dst, idx_t len) {
		using UNSIGNED = typename MakeUnsigned<SIGNED>::type;
		char *end = dst + len;
		if (value < 0) {
			value = -value;
			*dst = '-';
		}
		if (scale == 0) {
			NumericHelper::FormatUnsigned<UNSIGNED>(UnsafeNumericCast<UNSIGNED>(value), end);
			return;
		}
		// we write two numbers:
		// the numbers BEFORE the decimal (major)
		// and the numbers AFTER the decimal (minor)
		auto minor =
		    UnsafeNumericCast<UNSIGNED>(value) % UnsafeNumericCast<UNSIGNED>(NumericHelper::POWERS_OF_TEN[scale]);
		auto major =
		    UnsafeNumericCast<UNSIGNED>(value) / UnsafeNumericCast<UNSIGNED>(NumericHelper::POWERS_OF_TEN[scale]);
		// write the number after the decimal
		dst = NumericHelper::FormatUnsigned<UNSIGNED>(UnsafeNumericCast<UNSIGNED>(minor), end);
		// (optionally) pad with zeros and add the decimal point
		while (dst > (end - scale)) {
			*--dst = '0';
		}
		*--dst = '.';
		// now write the part before the decimal
		D_ASSERT(width > scale || major == 0);
		if (width > scale) {
			// there are numbers after the comma
			dst = NumericHelper::FormatUnsigned<UNSIGNED>(UnsafeNumericCast<UNSIGNED>(major), dst);
		}
	}